

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O3

XMLComment * __thiscall tinyxml2::XMLDocument::NewComment(XMLDocument *this,char *str)

{
  int iVar1;
  undefined4 extraout_var;
  XMLNode *this_00;
  
  iVar1 = (*(this->_commentPool).super_MemPool._vptr_MemPool[3])(&this->_commentPool);
  this_00 = (XMLNode *)CONCAT44(extraout_var,iVar1);
  XMLComment::XMLComment((XMLComment *)this_00,this);
  this_00->_memPool = &(this->_commentPool).super_MemPool;
  DynArray<tinyxml2::XMLNode_*,_10>::EnsureCapacity(&this->_unlinked,(this->_unlinked)._size + 1);
  iVar1 = (this->_unlinked)._size;
  (this->_unlinked)._mem[iVar1] = this_00;
  (this->_unlinked)._size = iVar1 + 1;
  StrPair::SetStr(&this_00->_value,str,0);
  return (XMLComment *)this_00;
}

Assistant:

XMLComment* XMLDocument::NewComment( const char* str )
{
    XMLComment* comment = CreateUnlinkedNode<XMLComment>( _commentPool );
    comment->SetValue( str );
    return comment;
}